

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

bool __thiscall QMdiSubWindow::event(QMdiSubWindow *this,QEvent *event)

{
  QLatin1StringView s;
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  Type TVar4;
  QFlagsStorage<Qt::WindowType> QVar5;
  int aw;
  QMdiSubWindowPrivate *pQVar6;
  QObject *pQVar7;
  QSizeGrip *pQVar8;
  QWidget *pQVar9;
  QMenuBar *pQVar10;
  QWidget *pQVar11;
  ulong uVar12;
  QStyle *pQVar13;
  QFont *pQVar14;
  QMdiSubWindowPrivate *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *unaff_retaddr;
  bool wasResized;
  bool wasMaximized;
  bool wasMinimized;
  bool wasShaded;
  QMdiSubWindowPrivate *d;
  QScopedValueRollback<bool> activationEnabledSaver;
  SubControl in_stack_fffffffffffffea8;
  ComplexControl in_stack_fffffffffffffeac;
  QMdiSubWindowPrivate *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  SubWindowOption in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  Corner in_stack_fffffffffffffec4;
  QMdiSubWindowPrivate *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  QWidget *in_stack_fffffffffffffed8;
  QSize *in_stack_fffffffffffffee0;
  QMdiSubWindowPrivate *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined2 uVar16;
  uint uVar15;
  WidgetAttribute attribute;
  bool activate;
  QMdiSubWindowPrivate *this_00;
  QIcon local_d0;
  QIcon local_c8 [4];
  QSize local_a8;
  QSize local_a0;
  QPalette local_28;
  undefined1 local_18 [16];
  QEvent *event_00;
  
  uVar1 = (undefined1)((uint)in_stack_ffffffffffffff10 >> 0x18);
  event_00 = *(QEvent **)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QMdiSubWindow *)0x6347eb);
  TVar4 = QEvent::type((QEvent *)in_RSI);
  bVar3 = SUB81((ulong)pQVar6 >> 0x30,0);
  activate = SUB81((ulong)pQVar6 >> 0x38,0);
  switch(TVar4) {
  case ParentChange:
    bVar3 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       (WidgetAttribute)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    attribute = CONCAT31((int3)((uint)in_stack_ffffffffffffff14 >> 8),bVar3);
    QMdiSubWindowPrivate::removeButtonsFromMenuBar
              ((QMdiSubWindowPrivate *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
              );
    pQVar6->currentOperation = None;
    pQVar6->activeSubControl = SC_None;
    pQVar6->hoveredSubControl = SC_None;
    if ((pQVar6->isInRubberBandMode & 1U) != 0) {
      QMdiSubWindowPrivate::leaveRubberBandMode
                ((QMdiSubWindowPrivate *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    pQVar6->isShadeMode = false;
    pQVar6->isMaximizeMode = false;
    pQVar6->isWidgetHiddenByUs = false;
    pQVar7 = QObject::parent((QObject *)0x634a36);
    if (pQVar7 == (QObject *)0x0) {
      QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar3 = isMacStyle((QStyle *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      if ((bVar3) &&
         (pQVar8 = ::QPointer::operator_cast_to_QSizeGrip_((QPointer<QSizeGrip> *)0x634a65),
         pQVar8 != (QSizeGrip *)0x0)) {
        (**(code **)(*(long *)&pQVar8->super_QWidget + 0x20))();
      }
      setOption((QMdiSubWindow *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebc,SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
      setOption((QMdiSubWindow *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                in_stack_fffffffffffffebc,SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
      this_00 = pQVar6;
    }
    else {
      this_00 = pQVar6;
      QVar5.i = (Int)QWidget::windowFlags((QWidget *)in_stack_fffffffffffffeb0);
      (**(code **)(*(long *)&pQVar6->super_QWidgetPrivate + 0x28))(pQVar6,QVar5.i);
      uVar1 = SUB41(QVar5.i,3);
    }
    QWidget::setContentsMargins
              ((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0);
    QMdiSubWindowPrivate::updateGeometryConstraints(in_stack_fffffffffffffec8);
    QMdiSubWindowPrivate::updateCursor
              ((QMdiSubWindowPrivate *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
              );
    QMdiSubWindowPrivate::updateMask(in_stack_fffffffffffffec8);
    QMdiSubWindowPrivate::updateDirtyRegions(in_stack_fffffffffffffeb0);
    QMdiSubWindowPrivate::updateActions(in_stack_fffffffffffffeb0);
    if (((attribute & WA_UnderMouse) == WA_Disabled) &&
       (bVar3 = QWidget::testAttribute
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffeb0 >> 0x20)), bVar3)) {
      QWidget::setAttribute((QWidget *)this_00,attribute,(bool)uVar1);
    }
    break;
  default:
    break;
  case WindowActivate:
    if ((pQVar6->ignoreNextActivationEvent & 1U) == 0) {
      pQVar6->isExplicitlyDeactivated = false;
      QMdiSubWindowPrivate::setActive(in_RSI,activate,bVar3);
    }
    else {
      pQVar6->ignoreNextActivationEvent = false;
    }
    break;
  case WindowDeactivate:
    if ((pQVar6->ignoreNextActivationEvent & 1U) == 0) {
      pQVar6->isExplicitlyDeactivated = true;
      QMdiSubWindowPrivate::setActive(in_RSI,activate,bVar3);
    }
    else {
      pQVar6->ignoreNextActivationEvent = false;
    }
    break;
  case WindowTitleChange:
    if ((pQVar6->ignoreWindowTitleChange & 1U) == 0) {
      QMdiSubWindowPrivate::updateWindowTitle
                (in_stack_fffffffffffffee8,SUB81((ulong)in_stack_fffffffffffffee0 >> 0x38,0));
    }
    QMdiSubWindowPrivate::updateInternalWindowTitle(in_RDI);
    break;
  case WindowIconChange:
    QWidget::windowIcon((QWidget *)in_stack_fffffffffffffec8);
    QIcon::operator=((QIcon *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (QIcon *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QIcon::~QIcon(local_c8);
    uVar12 = QIcon::isNull();
    if ((uVar12 & 1) != 0) {
      pQVar13 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      (**(code **)(*(long *)pQVar13 + 0x100))(&local_d0,pQVar13,0,0,in_RDI);
      QIcon::operator=((QIcon *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (QIcon *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QIcon::~QIcon(&local_d0);
    }
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QMdi::ControlContainer> *)0x634dd0);
    if (bVar3) {
      QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x634de7);
      QMdi::ControlContainer::updateWindowIcon
                ((ControlContainer *)in_stack_fffffffffffffeb0,
                 (QIcon *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    pQVar9 = maximizedSystemMenuIconWidget
                       ((QMdiSubWindow *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (pQVar9 == (QWidget *)0x0) {
      aw = QWidget::width((QWidget *)0x634e15);
      QMdiSubWindowPrivate::titleBarHeight(in_stack_fffffffffffffec8);
      QWidget::update((QWidget *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                      in_stack_fffffffffffffec0,aw,in_stack_fffffffffffffeb8);
    }
    break;
  case PaletteChange:
    QMdiSubWindowPrivate::desktopPalette(in_stack_fffffffffffffec8);
    QPalette::operator=((QPalette *)in_stack_fffffffffffffeb0,
                        (QPalette *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    QPalette::~QPalette(&local_28);
    break;
  case LayoutRequest:
    QMdiSubWindowPrivate::updateGeometryConstraints(in_stack_fffffffffffffec8);
    break;
  case LayoutDirectionChange:
    QMdiSubWindowPrivate::updateDirtyRegions(in_stack_fffffffffffffeb0);
    break;
  case FontChange:
    pQVar14 = QWidget::font((QWidget *)in_RDI);
    QFont::operator=(&pQVar6->font,pQVar14);
    break;
  case StyleChange:
    uVar1 = isShaded((QMdiSubWindow *)0x63482d);
    bVar3 = QWidget::isMinimized((QWidget *)in_RDI);
    uVar16 = CONCAT11(uVar1,bVar3);
    bVar3 = QWidget::isMaximized((QWidget *)in_RDI);
    uVar15 = (uint)CONCAT21(uVar16,bVar3) << 8;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QScopedValueRollback<bool>::QScopedValueRollback
              ((QScopedValueRollback<bool> *)local_18,&pQVar6->activationEnabled);
    pQVar6->activationEnabled = false;
    QWidget::ensurePolished(in_stack_fffffffffffffed8);
    QWidget::setContentsMargins
              ((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(int)in_stack_fffffffffffffeb0);
    if ((((uVar15 & 0x10000) != 0) || ((uVar15 & 0x100) != 0)) || ((uVar15 & 0x1000000) != 0)) {
      QWidget::showNormal((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    QMdiSubWindowPrivate::updateGeometryConstraints(in_stack_fffffffffffffec8);
    pQVar9 = (QWidget *)&pQVar6->internalMinimumSize;
    local_a8 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    local_a0 = QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),
                                 (QSize *)in_stack_fffffffffffffeb0);
    QWidget::resize(pQVar9,in_stack_fffffffffffffee0);
    QMdiSubWindowPrivate::updateMask(in_stack_fffffffffffffec8);
    QMdiSubWindowPrivate::updateDirtyRegions(in_stack_fffffffffffffeb0);
    if ((uVar15 & 0x1000000) == 0) {
      if ((uVar15 & 0x10000) == 0) {
        if ((uVar15 & 0x100) != 0) {
          QWidget::showMaximized
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        }
      }
      else {
        QWidget::showMinimized((QWidget *)in_stack_fffffffffffffeb0);
      }
    }
    else {
      showShaded((QMdiSubWindow *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    }
    QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)local_18);
    break;
  case ModifiedChange:
    QWidget::windowTitle((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (size_t)in_stack_fffffffffffffeb0);
    s.m_size._4_4_ = in_stack_fffffffffffffec4;
    s.m_size._0_4_ = in_stack_fffffffffffffec0;
    s.m_data = (char *)in_stack_fffffffffffffec8;
    bVar3 = QString::contains((QString *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),s,
                              CaseInsensitive);
    bVar2 = bVar3 ^ 0xff;
    QString::~QString((QString *)0x634c49);
    if ((bVar2 & 1) == 0) {
      pQVar9 = maximizedButtonsWidget
                         ((QMdiSubWindow *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (pQVar9 != (QWidget *)0x0) {
        QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x634c7d);
        pQVar10 = QMdi::ControlContainer::menuBar((ControlContainer *)0x634c85);
        if (pQVar10 != (QMenuBar *)0x0) {
          QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x634c9c)
          ;
          QMdi::ControlContainer::menuBar((ControlContainer *)0x634ca4);
          pQVar9 = QMenuBar::cornerWidget
                             ((QMenuBar *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
          pQVar11 = maximizedButtonsWidget
                              ((QMdiSubWindow *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          if (pQVar9 == pQVar11) {
            pQVar11 = QWidget::window((QWidget *)
                                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
            ;
            uVar1 = (undefined1)((ulong)pQVar11 >> 0x38);
            QWidget::isWindowModified((QWidget *)0x634ce6);
            QWidget::setWindowModified(pQVar9,(bool)uVar1);
          }
        }
      }
      QMdiSubWindowPrivate::updateInternalWindowTitle(in_RDI);
    }
    break;
  case ToolTip:
    QMdiSubWindowPrivate::titleBarOptions(in_stack_fffffffffffffee8);
    showToolTip((QHelpEvent *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                (QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                (QStyleOptionComplex *)in_RSI,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)in_RSI);
    break;
  case ActionChanged:
  case ActionAdded:
  case ActionRemoved:
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    break;
  case ParentAboutToChange:
    QMdiSubWindowPrivate::setActive(in_RSI,activate,bVar3);
  }
  bVar3 = QWidget::event(unaff_retaddr,event_00);
  if (*(QEvent **)(in_FS_OFFSET + 0x28) == event_00) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::event(QEvent *event)
{
    Q_D(QMdiSubWindow);
    switch (event->type()) {
    case QEvent::StyleChange: {
        bool wasShaded = isShaded();
        bool wasMinimized = isMinimized();
        bool wasMaximized = isMaximized();
        // Don't emit subWindowActivated, the app doesn't have to know about our hacks
        const QScopedValueRollback<bool> activationEnabledSaver(d->activationEnabled);
        d->activationEnabled = false;

        ensurePolished();
        setContentsMargins(0, 0, 0, 0);
        if (wasMinimized || wasMaximized || wasShaded)
            showNormal();
        d->updateGeometryConstraints();
        resize(d->internalMinimumSize.expandedTo(size()));
        d->updateMask();
        d->updateDirtyRegions();
        if (wasShaded)
            showShaded();
        else if (wasMinimized)
            showMinimized();
        else if (wasMaximized)
            showMaximized();
        break;
    }
    case QEvent::ParentAboutToChange:
        d->setActive(false);
        break;
    case QEvent::ParentChange: {
        bool wasResized = testAttribute(Qt::WA_Resized);
#if QT_CONFIG(menubar)
        d->removeButtonsFromMenuBar();
#endif
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->activeSubControl = QStyle::SC_None;
        d->hoveredSubControl = QStyle::SC_None;
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode)
            d->leaveRubberBandMode();
#endif
        d->isShadeMode = false;
        d->isMaximizeMode = false;
        d->isWidgetHiddenByUs = false;
        if (!parent()) {
#if QT_CONFIG(sizegrip)
            if (isMacStyle(style()))
                delete d->sizeGrip;
#endif
            setOption(RubberBandResize, false);
            setOption(RubberBandMove, false);
        } else {
            d->setWindowFlags(windowFlags());
        }
        setContentsMargins(0, 0, 0, 0);
        d->updateGeometryConstraints();
        d->updateCursor();
        d->updateMask();
        d->updateDirtyRegions();
        d->updateActions();
        if (!wasResized && testAttribute(Qt::WA_Resized))
            setAttribute(Qt::WA_Resized, false);
        break;
    }
    case QEvent::WindowActivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = false;
        d->setActive(true);
        break;
    case QEvent::WindowDeactivate:
        if (d->ignoreNextActivationEvent) {
            d->ignoreNextActivationEvent = false;
            break;
        }
        d->isExplicitlyDeactivated = true;
        d->setActive(false);
        break;
    case QEvent::WindowTitleChange:
        if (!d->ignoreWindowTitleChange)
            d->updateWindowTitle(false);
        d->updateInternalWindowTitle();
        break;
    case QEvent::ModifiedChange:
        if (!windowTitle().contains("[*]"_L1))
            break;
#if QT_CONFIG(menubar)
        if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            window()->setWindowModified(isWindowModified());
        }
#endif // QT_CONFIG(menubar)
        d->updateInternalWindowTitle();
        break;
    case QEvent::LayoutDirectionChange:
        d->updateDirtyRegions();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowIconChange:
        d->menuIcon = windowIcon();
        if (d->menuIcon.isNull())
            d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
        if (d->controlContainer)
            d->controlContainer->updateWindowIcon(d->menuIcon);
        if (!maximizedSystemMenuIconWidget())
            update(0, 0, width(), d->titleBarHeight());
        break;
    case QEvent::PaletteChange:
        d->titleBarPalette = d->desktopPalette();
        break;
    case QEvent::FontChange:
        d->font = font();
        break;
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip:
        showToolTip(static_cast<QHelpEvent *>(event), this, d->titleBarOptions(),
                    QStyle::CC_TitleBar, d->hoveredSubControl);
        break;
#endif
#ifndef QT_NO_ACTION
    case QEvent::ActionAdded:
    case QEvent::ActionChanged:
    case QEvent::ActionRemoved:
        update();
        break;
#endif
    default:
        break;
    }
    return QWidget::event(event);
}